

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBuilderBeamTaperedTimoshenko::BuildBeam
          (ChBuilderBeamTaperedTimoshenko *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric> *sect,int N,
          shared_ptr<chrono::fea::ChNodeFEAxyzrot> *nodeA,
          shared_ptr<chrono::fea::ChNodeFEAxyzrot> *nodeB,ChVector<double> *Ydir)

{
  element_type *peVar1;
  element_type *peVar2;
  ChMesh *pCVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  undefined1 auVar9 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  ChNodeFEAxyzrot *pCVar11;
  ChElementBeamTaperedTimoshenko *this_01;
  undefined4 in_register_0000000c;
  pointer psVar12;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *this_02;
  ChVector<double> *mv;
  value_type *size;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  double dVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  ChMatrix33<double> mrot;
  ChVector<double> v;
  shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko> element;
  value_type local_338;
  ulong local_320;
  ChNodeFEAxyzrot *local_318;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_310;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> *local_308;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> *local_300;
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [32];
  undefined1 local_298 [32];
  undefined1 local_278 [32];
  element_type *local_258;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_250;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_248;
  element_type *local_238;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_230;
  element_type *local_228;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_220;
  shared_ptr<chrono::fea::ChElementBase> local_218;
  ChElementBeamTaperedTimoshenko *local_208;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_200;
  ulong local_1f8;
  double local_1f0;
  ChBuilderBeamTaperedTimoshenko *local_1e8;
  ChMatrix33<double> local_1e0;
  undefined1 local_198 [16];
  ChVector<double> local_188;
  undefined1 local_168 [128];
  double local_e8;
  undefined1 local_d8 [32];
  undefined1 local_b8 [128];
  double local_38;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  local_320 = CONCAT44(in_register_0000000c,N);
  std::
  vector<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>_>_>
  ::clear(&this->beam_elems);
  this_02 = &this->beam_nodes;
  local_1e8 = this;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::clear(this_02);
  peVar1 = (nodeB->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar2 = (nodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  dVar59 = *(double *)&(peVar1->super_ChNodeFEAbase).field_0x20 -
           *(double *)&(peVar2->super_ChNodeFEAbase).field_0x20;
  auVar15 = vsubpd_avx(*(undefined1 (*) [16])&peVar1->field_0x28,
                       *(undefined1 (*) [16])&peVar2->field_0x28);
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  if ((dVar59 != 0.0) || (NAN(dVar59))) {
LAB_005e485a:
    dVar47 = auVar15._0_8_;
    auVar15 = vshufpd_avx(auVar15,auVar15,1);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar47 * dVar47;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar59;
    auVar14 = vfmadd231sd_fma(auVar16,auVar41,auVar41);
    auVar14 = vfmadd231sd_fma(auVar14,auVar15,auVar15);
    auVar14 = vsqrtsd_avx(auVar14,auVar14);
    bVar8 = 2.2250738585072014e-308 <= auVar14._0_8_;
    dVar52 = 1.0 / auVar14._0_8_;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = (ulong)bVar8 * (long)(auVar15._0_8_ * dVar52);
    local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         (double)((ulong)bVar8 * (long)(dVar47 * dVar52));
    auVar15._0_8_ = (ulong)bVar8 * (long)(dVar59 * dVar52) + (ulong)!bVar8 * 0x3ff0000000000000;
    auVar15._8_8_ = 0;
  }
  else {
    uVar13 = vcmppd_avx512vl(auVar15,ZEXT816(0) << 0x40,0);
    if (((uVar13 & 1) == 0) || ((uVar13 & 3) >> 1 == 0)) goto LAB_005e485a;
    auVar15 = ZEXT816(0x3ff0000000000000);
    auVar14 = ZEXT816(0) << 0x40;
  }
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar60._8_8_ = 0;
  auVar60._0_8_ = Ydir->m_data[2];
  auVar67._8_8_ = 0;
  auVar67._0_8_ = Ydir->m_data[0];
  auVar63._8_8_ = 0;
  auVar63._0_8_ = Ydir->m_data[1];
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar15._0_8_;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       auVar14._0_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       Ydir->m_data[2] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar16 = vfmsub231sd_fma(auVar53,auVar14,auVar67);
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       Ydir->m_data[1] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar41 = vfmsub231sd_fma(auVar48,auVar9,auVar60);
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar41._0_8_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       Ydir->m_data[0] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar42 = vfmsub231sd_fma(auVar42,auVar15,auVar63);
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar42._0_8_;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar16._0_8_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar16 = vfmadd231sd_fma(auVar70,auVar41,auVar41);
  auVar16 = vfmadd231sd_fma(auVar16,auVar42,auVar42);
  auVar16 = vsqrtsd_avx(auVar16,auVar16);
  dVar59 = auVar16._0_8_;
  if (0.0001 <= dVar59) goto LAB_005e49ad;
  auVar5._8_8_ = 0x7fffffffffffffff;
  auVar5._0_8_ = 0x7fffffffffffffff;
  auVar16 = vandpd_avx512vl(auVar67,auVar5);
  if (0.9 <= auVar16._0_8_) {
    auVar6._8_8_ = 0x7fffffffffffffff;
    auVar6._0_8_ = 0x7fffffffffffffff;
    auVar16 = vandpd_avx512vl(auVar63,auVar6);
    if (0.9 <= auVar16._0_8_) {
      auVar7._8_8_ = 0x7fffffffffffffff;
      auVar7._0_8_ = 0x7fffffffffffffff;
      auVar16 = vandpd_avx512vl(auVar60,auVar7);
      auVar41 = ZEXT816(0);
      if (0.9 <= auVar16._0_8_) goto LAB_005e4977;
      auVar16 = ZEXT816(0x3ff0000000000000);
    }
    else {
      auVar41 = ZEXT816(0x3ff0000000000000);
LAB_005e4977:
      auVar16 = ZEXT816(0);
    }
    auVar42 = ZEXT816(0);
  }
  else {
    auVar42 = ZEXT816(0x3ff0000000000000);
    auVar16 = ZEXT816(0);
    auVar41 = ZEXT816(0);
  }
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       auVar16._0_8_ *
       -local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar48 = vfmadd231sd_fma(auVar54,auVar14,auVar42);
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       auVar41._0_8_ *
       -local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar16 = vfmadd231sd_fma(auVar49,auVar9,auVar16);
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar16._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       auVar42._0_8_ *
       -local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar41 = vfmadd231sd_fma(auVar43,auVar15,auVar41);
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar41._0_8_;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar48._0_8_;
  auVar61._8_8_ = 0;
  auVar61._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar16 = vfmadd231sd_fma(auVar61,auVar16,auVar16);
  auVar16 = vfmadd231sd_fma(auVar16,auVar41,auVar41);
  auVar16 = vsqrtsd_avx(auVar16,auVar16);
  dVar59 = auVar16._0_8_;
LAB_005e49ad:
  dVar59 = 1.0 / dVar59;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] *
       dVar59;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       dVar59;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
       dVar59;
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar62._8_8_ = 0;
  auVar62._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar14 = vfmsub231sd_fma(auVar62,auVar55,auVar14);
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar15 = vfmsub231sd_fma(auVar64,auVar44,auVar15);
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar68._8_8_ = 0;
  auVar68._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar16 = vfmsub231sd_fma(auVar68,auVar50,auVar9);
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar14._0_8_;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar15._0_8_;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar16._0_8_;
  local_308 = nodeB;
  local_300 = nodeA;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::push_back(this_02,nodeA);
  if (0 < (int)local_320) {
    uVar13 = 1;
    local_200 = &(local_308->
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount;
    local_1f0 = (double)(int)local_320;
    local_1f8 = local_320 & 0xffffffff;
    local_320 = (ulong)((int)local_320 + 1);
    local_208 = (ChElementBeamTaperedTimoshenko *)&PTR__ChFrame_00b03780;
    do {
      dVar59 = (double)(int)uVar13 / local_1f0;
      peVar1 = (local_300->
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pCVar11 = (local_308->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      local_188.m_data[2] = *(double *)&peVar1->field_0x30;
      auVar15 = *(undefined1 (*) [16])&(peVar1->super_ChNodeFEAbase).field_0x20;
      auVar14 = vsubpd_avx(*(undefined1 (*) [16])&(pCVar11->super_ChNodeFEAbase).field_0x20,auVar15)
      ;
      local_188.m_data[0] = auVar15._0_8_ + dVar59 * auVar14._0_8_;
      local_188.m_data[1] = auVar15._8_8_ + dVar59 * auVar14._8_8_;
      local_188.m_data[2] =
           local_188.m_data[2] + dVar59 * (*(double *)&pCVar11->field_0x30 - local_188.m_data[2]);
      local_338.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      local_338.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (uVar13 < local_1f8) {
        mv = &local_188;
        ChFrame<double>::ChFrame((ChFrame<double> *)local_b8,mv,&local_1e0);
        pCVar11 = (ChNodeFEAxyzrot *)
                  ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)mv);
        local_168._0_8_ = local_208;
        local_168._8_8_ = local_b8._8_8_;
        local_168._16_8_ = local_b8._16_8_;
        local_168._24_8_ = local_b8._24_8_;
        local_168._32_8_ = local_b8._32_8_;
        local_168._40_8_ = local_b8._40_8_;
        local_168._48_8_ = local_b8._48_8_;
        local_168._56_8_ = local_b8._56_8_;
        local_e8 = local_38;
        local_168._64_64_ = local_b8._64_64_;
        ChNodeFEAxyzrot::ChNodeFEAxyzrot(pCVar11,(ChFrame<double> *)local_168);
        local_318 = pCVar11;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<chrono::fea::ChNodeFEAxyzrot*>(&_Stack_310,pCVar11);
        _Var10._M_pi = _Stack_310._M_pi;
        local_338.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_318;
        this_00._M_pi =
             local_338.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        local_318 = (ChNodeFEAxyzrot *)0x0;
        _Stack_310._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_338.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var10._M_pi;
        if ((this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi),
           _Stack_310._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_310._M_pi);
        }
        pCVar3 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_248.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = &(local_338.
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->super_ChNodeFEAbase;
        if (local_338.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_338.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_338.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_338.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_338.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_248.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             local_338.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        ChMesh::AddNode(pCVar3,&local_248);
        if (local_248.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_248.
                     super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      else {
        local_338.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = pCVar11;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_338.
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,local_200);
      }
      size = &local_338;
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::push_back(this_02,&local_338);
      this_01 = (ChElementBeamTaperedTimoshenko *)
                ChElementBeamTaperedTimoshenko::operator_new
                          ((ChElementBeamTaperedTimoshenko *)0x238,(size_t)size);
      ChElementBeamTaperedTimoshenko::ChElementBeamTaperedTimoshenko(this_01);
      local_168._0_8_ = this_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChElementBeamTaperedTimoshenko*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 8),this_01);
      pCVar3 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_218.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_168._0_8_;
      local_218.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_168._8_8_ + 8) = *(_Atomic_word *)(local_168._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_168._8_8_ + 8) = *(_Atomic_word *)(local_168._8_8_ + 8) + 1;
        }
      }
      ChMesh::AddElement(pCVar3,&local_218);
      if (local_218.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_218.
                   super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>_>_>
      ::push_back(&local_1e8->beam_elems,(value_type *)local_168);
      psVar12 = (this_02->
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_228 = psVar12[uVar13 - 1].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      p_Stack_220 = psVar12[uVar13 - 1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      p_Var4 = psVar12[uVar13 - 1].
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
          psVar12 = (this_02->
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      local_238 = psVar12[uVar13].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      p_Stack_230 = psVar12[uVar13].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      p_Var4 = psVar12[uVar13].
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      (*(((ChElementBeam *)local_168._0_8_)->super_ChElementGeneric).super_ChElementBase.
        _vptr_ChElementBase[0x1a])(local_168._0_8_,&local_228,&local_238);
      if (p_Stack_230 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_230);
      }
      if (p_Stack_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_220);
      }
      auVar65._8_8_ = 0;
      auVar65._0_8_ =
           local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      auVar56._8_8_ =
           local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      auVar56._0_8_ =
           local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar71._8_8_ = 0;
      auVar71._0_8_ =
           local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      dVar59 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0] + local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[4] +
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8];
      if (0.0 <= dVar59) {
        dVar59 = dVar59 + 1.0;
        if (dVar59 < 0.0) {
          local_278._0_16_ = auVar56;
          local_298._0_16_ = auVar65;
          local_2b8._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
          local_2d8._0_16_ = auVar71;
          local_2f8._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
          auVar28._0_8_ = sqrt(dVar59);
          auVar28._8_56_ = extraout_var;
          auVar15 = auVar28._0_16_;
          auVar71 = local_2d8._0_16_;
          dVar59 = (double)local_2f8._0_8_;
          auVar65 = local_298._0_16_;
          auVar56 = local_278._0_16_;
          dVar47 = (double)local_2b8._0_8_;
        }
        else {
          auVar20._8_8_ = 0;
          auVar20._0_8_ = dVar59;
          auVar15 = vsqrtsd_avx(auVar20,auVar20);
          dVar59 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
          dVar47 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
        }
        auVar45._8_8_ = 0x3fe0000000000000;
        auVar45._0_8_ = 0x3fe0000000000000;
        auVar14 = vunpcklpd_avx(auVar71,auVar65);
        auVar14 = vsubpd_avx(auVar14,auVar56);
        auVar32._0_8_ = 0.5 / auVar15._0_8_;
        auVar32._8_8_ = auVar32._0_8_;
        auVar40 = ZEXT1632(CONCAT88(auVar14._8_8_ * auVar32._0_8_,auVar14._0_8_ * auVar32._0_8_));
        auVar33 = vunpcklpd_avx(auVar45,auVar32);
        auVar34._8_8_ = 0;
        auVar34._0_8_ = dVar59 - dVar47;
        auVar24 = vunpcklpd_avx(auVar15,auVar34);
      }
      else if (local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4] <= local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[0]) {
        if (local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] <
            local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8])
        goto LAB_005e4e57;
        dVar59 = ((local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0] -
                  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4]) -
                 local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8]) + 1.0;
        if (dVar59 < 0.0) {
          local_278._0_16_ = auVar56;
          local_298._0_16_ = auVar65;
          local_2b8._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
          local_2d8._0_16_ = auVar71;
          local_2f8._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
          auVar31._0_8_ = sqrt(dVar59);
          auVar31._8_56_ = extraout_var_02;
          auVar15 = auVar31._0_16_;
          dVar59 = (double)local_2f8._0_8_;
          auVar71 = local_2d8._0_16_;
          dVar47 = (double)local_298._0_8_;
          auVar56 = local_278._0_16_;
          dVar52 = (double)local_2b8._0_8_;
        }
        else {
          auVar22._8_8_ = 0;
          auVar22._0_8_ = dVar59;
          auVar15 = vsqrtsd_avx(auVar22,auVar22);
          dVar59 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
          dVar47 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
          dVar52 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
        }
        auVar33._0_8_ = 0.5 / auVar15._0_8_;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = dVar52 + dVar59;
        auVar15 = vunpcklpd_avx(auVar15,auVar38);
        auVar39._8_8_ = 0x3fe0000000000000;
        auVar39._0_8_ = 0x3fe0000000000000;
        auVar33._8_8_ = auVar33._0_8_;
        auVar14 = vunpcklpd_avx(auVar39,auVar33);
        auVar40 = ZEXT1632(CONCAT88(auVar15._8_8_ * auVar14._8_8_,auVar15._0_8_ * auVar14._0_8_));
        auVar15 = vsubpd_avx(auVar71,auVar56);
        auVar24._8_8_ = dVar47 + auVar56._8_8_;
        auVar24._0_8_ = auVar15._0_8_;
      }
      else if (local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4] < local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8]) {
LAB_005e4e57:
        dVar59 = ((local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8] -
                  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[0]) -
                 local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4]) + 1.0;
        if (dVar59 < 0.0) {
          local_278._0_16_ = auVar56;
          local_298._0_16_ = auVar65;
          local_2b8._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
          local_2d8._0_16_ = auVar71;
          local_2f8._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
          auVar29._0_8_ = sqrt(dVar59);
          auVar29._8_56_ = extraout_var_00;
          auVar15 = auVar29._0_16_;
          auVar71 = local_2d8._0_16_;
          dVar59 = (double)local_2f8._0_8_;
          auVar65 = local_298._0_16_;
          auVar56 = local_278._0_16_;
          dVar47 = (double)local_2b8._0_8_;
        }
        else {
          auVar21._8_8_ = 0;
          auVar21._0_8_ = dVar59;
          auVar15 = vsqrtsd_avx(auVar21,auVar21);
          dVar59 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
          dVar47 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
        }
        auVar16 = vunpcklpd_avx(auVar65,auVar71);
        auVar14 = vshufpd_avx(auVar56,auVar56,1);
        auVar33._0_8_ = 0.5 / auVar15._0_8_;
        auVar40 = ZEXT1632(CONCAT88((auVar14._8_8_ + auVar16._8_8_) * auVar33._0_8_,
                                    (auVar14._0_8_ + auVar16._0_8_) * auVar33._0_8_));
        auVar33._8_8_ = 0x3fe0000000000000;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = dVar59 - dVar47;
        auVar24 = vunpcklpd_avx(auVar35,auVar15);
      }
      else {
        dVar59 = ((local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4] -
                  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[8]) -
                 local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0]) + 1.0;
        if (dVar59 < 0.0) {
          local_278._0_16_ = auVar56;
          local_298._0_16_ = auVar65;
          local_2b8._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
          local_2d8._0_16_ = auVar71;
          local_2f8._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
          auVar30._0_8_ = sqrt(dVar59);
          auVar30._8_56_ = extraout_var_01;
          auVar15 = auVar30._0_16_;
          dVar59 = (double)local_2f8._0_8_;
          auVar71 = local_2d8._0_16_;
          dVar47 = (double)local_298._0_8_;
          auVar56 = local_278._0_16_;
          dVar52 = (double)local_2b8._0_8_;
        }
        else {
          auVar19._8_8_ = 0;
          auVar19._0_8_ = dVar59;
          auVar15 = vsqrtsd_avx(auVar19,auVar19);
          dVar59 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
          dVar47 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
          dVar52 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
        }
        auVar33._0_8_ = 0.5 / auVar15._0_8_;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = dVar52 + dVar59;
        auVar15 = vunpcklpd_avx(auVar36,auVar15);
        auVar33._8_8_ = auVar33._0_8_;
        auVar40 = ZEXT1632(CONCAT88(auVar15._8_8_ * 0.5,auVar15._0_8_ * auVar33._0_8_));
        auVar23._8_8_ = dVar47;
        auVar23._0_8_ = dVar47;
        auVar37._0_8_ = auVar71._0_8_ + auVar56._0_8_;
        auVar37._8_8_ = auVar71._8_8_ + auVar56._8_8_;
        auVar15 = vsubpd_avx(auVar23,auVar56);
        auVar24 = vshufpd_avx(auVar15,auVar37,1);
      }
      auVar15 = auVar40._0_16_;
      auVar57._0_8_ = auVar24._0_8_ * auVar33._0_8_;
      auVar57._8_8_ = auVar24._8_8_ * auVar33._8_8_;
      psVar12 = (((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                   *)(local_168._0_8_ + 0xb0))->
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      peVar1 = (psVar12->
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var4 = (psVar12->
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      auVar14 = vshufpd_avx(auVar57,auVar57,1);
      auVar46._24_8_ = *(undefined8 *)&peVar1->field_0x40;
      auVar46._16_8_ = *(undefined8 *)&peVar1->field_0x40;
      auVar72._8_8_ = auVar57._0_8_;
      auVar72._0_8_ = auVar57._0_8_;
      auVar72._16_8_ = auVar57._0_8_;
      auVar72._24_8_ = auVar57._0_8_;
      auVar66._0_8_ = auVar40._0_8_ ^ 0x8000000000000000;
      auVar66._8_8_ = auVar40._8_8_ ^ 0x8000000000000000;
      uVar18 = auVar14._0_8_ ^ 0x8000000000000000;
      auVar27 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])&peVar1->field_0x48),0x15);
      auVar14 = vunpcklpd_avx(auVar15,auVar66);
      auVar16 = vshufpd_avx(auVar66,auVar66,1);
      auVar69._8_8_ = uVar18;
      auVar69._0_8_ = uVar18;
      auVar69._16_8_ = uVar18;
      auVar69._24_8_ = uVar18;
      auVar17._16_16_ = auVar16;
      auVar17._0_16_ = auVar14;
      auVar17 = vblendpd_avx(auVar17,auVar69,8);
      auVar46._8_8_ = *(undefined8 *)&peVar1->field_0x48;
      auVar46._0_8_ = *(undefined8 *)&peVar1->field_0x48;
      auVar58 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])&peVar1->field_0x38),1);
      auVar25._0_8_ = auVar17._0_8_ * auVar58._0_8_;
      auVar25._8_8_ = auVar17._8_8_ * auVar58._8_8_;
      auVar25._16_8_ = auVar17._16_8_ * auVar58._16_8_;
      auVar25._24_8_ = auVar17._24_8_ * auVar58._24_8_;
      auVar41 = vfmadd231pd_fma(auVar25,auVar72,*(undefined1 (*) [32])&peVar1->field_0x38);
      auVar17 = vpermpd_avx2(auVar40,0x55);
      auVar58 = ZEXT1632(auVar57);
      auVar17 = vblendpd_avx(auVar17,auVar58,2);
      auVar17 = vblendpd_avx(auVar17,auVar69,4);
      auVar41 = vfmadd213pd_fma(auVar46,auVar17,ZEXT1632(auVar41));
      auVar17 = vpermt2pd_avx512f(_DAT_0096b5c0,auVar58);
      auVar41 = vfmadd213pd_fma(auVar17,auVar27,ZEXT1632(auVar41));
      *(undefined1 (*) [32])((ChQuaternion<double> *)(local_168._0_8_ + 0x168))->m_data =
           ZEXT1632(auVar41);
      auVar17 = ZEXT1632(auVar66);
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_2b8 = ZEXT1632(auVar66);
        local_2f8 = ZEXT1632(auVar14);
        local_2d8 = auVar69;
        local_298 = auVar58;
        local_278 = auVar40;
        local_198 = auVar16;
        local_d8 = auVar72;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        auVar14 = local_2f8._0_16_;
        auVar57 = local_298._0_16_;
        auVar15 = local_278._0_16_;
        auVar69 = local_2d8;
        auVar16 = local_198;
        auVar72 = local_d8;
        auVar17 = local_2b8;
      }
      psVar12 = (((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                   *)(local_168._0_8_ + 0xb0))->
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      peVar1 = psVar12[1].
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var4 = psVar12[1].
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      auVar40._16_16_ = auVar16;
      auVar40._0_16_ = auVar14;
      auVar51._8_8_ = *(undefined8 *)&peVar1->field_0x48;
      auVar51._0_8_ = *(undefined8 *)&peVar1->field_0x48;
      auVar40 = vblendpd_avx(auVar40,auVar69,8);
      auVar27 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])&peVar1->field_0x38),1);
      auVar58 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])&peVar1->field_0x48),0x15);
      auVar26._0_8_ = auVar40._0_8_ * auVar27._0_8_;
      auVar26._8_8_ = auVar40._8_8_ * auVar27._8_8_;
      auVar26._16_8_ = auVar40._16_8_ * auVar27._16_8_;
      auVar26._24_8_ = auVar40._24_8_ * auVar27._24_8_;
      auVar16 = vfmadd231pd_fma(auVar26,auVar72,*(undefined1 (*) [32])&peVar1->field_0x38);
      auVar14 = vunpckhpd_avx(auVar15,auVar57);
      auVar51._24_8_ = *(undefined8 *)&peVar1->field_0x40;
      auVar51._16_8_ = *(undefined8 *)&peVar1->field_0x40;
      auVar40 = vblendpd_avx(ZEXT1632(auVar14),auVar69,4);
      auVar40 = vpermpd_avx2(auVar40,0x24);
      auVar16 = vfmadd213pd_fma(auVar51,auVar40,ZEXT1632(auVar16));
      auVar27._16_16_ = auVar15;
      auVar27._0_16_ = auVar14;
      auVar40 = vpermpd_avx2(auVar17,0x11);
      auVar40 = vshufpd_avx(auVar27,auVar40,9);
      auVar15 = vfmadd213pd_fma(auVar40,auVar58,ZEXT1632(auVar16));
      *(undefined1 (*) [32])((ChQuaternion<double> *)(local_168._0_8_ + 0x188))->m_data =
           ZEXT1632(auVar15);
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      local_258 = (sect->
                  super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
      local_250._M_pi =
           (sect->
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
      if (local_250._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_250._M_pi)->_M_use_count = (local_250._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_250._M_pi)->_M_use_count = (local_250._M_pi)->_M_use_count + 1;
        }
      }
      (((shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric> *)
       (local_168._0_8_ + 200))->
      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = local_258;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(((shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric> *)
                   (local_168._0_8_ + 200))->
                  super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount,&local_250);
      if (local_250._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_250._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
      }
      if (local_338.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_338.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != local_320);
  }
  return;
}

Assistant:

void ChBuilderBeamTaperedTimoshenko::BuildBeam(
    std::shared_ptr<ChMesh> mesh,              // mesh to store the resulting elements
    std::shared_ptr<ChBeamSectionTaperedTimoshenkoAdvancedGeneric> sect,  // section material for beam elements
                                   const int N,                               // number of elements in the segment
                                   std::shared_ptr<ChNodeFEAxyzrot> nodeA,    // starting point
                                   std::shared_ptr<ChNodeFEAxyzrot> nodeB,    // ending point
                                   const ChVector<> Ydir                      // the 'up' Y direction of the beam
) {
    beam_elems.clear();
    beam_nodes.clear();

    ChMatrix33<> mrot;
    mrot.Set_A_Xdir(nodeB->Frame().GetPos() - nodeA->Frame().GetPos(), Ydir);

    beam_nodes.push_back(nodeA);

    for (int i = 1; i <= N; ++i) {
        double eta = (double)i / (double)N;
        ChVector<> pos = nodeA->Frame().GetPos() + (nodeB->Frame().GetPos() - nodeA->Frame().GetPos()) * eta;

        std::shared_ptr<ChNodeFEAxyzrot> nodeBi;
        if (i < N) {
            nodeBi = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(pos, mrot));
            mesh->AddNode(nodeBi);
        } else
            nodeBi = nodeB;  // last node: use the one passed as parameter.

        beam_nodes.push_back(nodeBi);

        auto element = chrono_types::make_shared<ChElementBeamTaperedTimoshenko>();
        mesh->AddElement(element);
        beam_elems.push_back(element);

        element->SetNodes(beam_nodes[i - 1], beam_nodes[i]);

        ChQuaternion<> elrot = mrot.Get_A_quaternion();
        element->SetNodeAreferenceRot(elrot.GetConjugate() % element->GetNodeA()->Frame().GetRot());
        element->SetNodeBreferenceRot(elrot.GetConjugate() % element->GetNodeB()->Frame().GetRot());

        element->SetTaperedSection(sect);
    }
}